

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildSystem.cpp
# Opt level: O2

void __thiscall
anon_unknown.dwarf_2cfb1b::FilteredDirectoryContentsTask::inputsAvailable
          (FilteredDirectoryContentsTask *this,TaskInterface ti)

{
  Kind KVar1;
  StringRef path;
  pointer pbVar2;
  pointer pbVar3;
  pointer pSVar4;
  bool bVar5;
  MATCH_RESULT MVar6;
  FileInfo *this_00;
  directory_iterator *pdVar7;
  ulong uVar8;
  size_type sVar9;
  long lVar10;
  uint64_t *puVar11;
  pointer pSVar12;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  __i;
  long lVar13;
  pointer pbVar14;
  byte bVar15;
  ArrayRef<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> values;
  FileInfo in_stack_fffffffffffffe28;
  allocator local_17a;
  allocator local_179;
  TaskInterface ti_local;
  StringRef local_168;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  filenames;
  error_code ec;
  directory_iterator it;
  vector<llvm::StringRef,_std::allocator<llvm::StringRef>_> filterStrings;
  directory_iterator local_e8;
  string filename;
  StringRef local_60;
  string local_50;
  
  ti_local.ctx = ti.ctx;
  ti_local.impl = ti.impl;
  bVar15 = 0;
  KVar1 = (this->directoryValue).kind;
  if (KVar1 == ExistingInput) {
    this_00 = llbuild::buildsystem::BuildValue::getOutputInfo(&this->directoryValue);
    bVar5 = llbuild::basic::FileInfo::isDirectory(this_00);
    if (bVar5) {
      filenames.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      filenames.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      filenames.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_60.Data = (this->path)._M_dataplus._M_p;
      local_60.Length = (this->path)._M_string_length;
      llbuild::basic::StringList::getValues(&filterStrings,&this->filters);
      ec._M_value = 0;
      ec._M_cat = (error_category *)std::_V2::system_category();
      llvm::Twine::Twine((Twine *)&filename,&local_60);
      sVar9 = 1;
      llvm::sys::fs::directory_iterator::directory_iterator(&it,(Twine *)&filename,&ec,true);
      local_e8.State.
      super___shared_ptr<llvm::sys::fs::detail::DirIterState,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      local_e8.State.
      super___shared_ptr<llvm::sys::fs::detail::DirIterState,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_e8.FollowSymlinks = true;
      local_e8._17_7_ = 0;
      do {
        bVar5 = llvm::sys::fs::directory_iterator::operator!=(&it,&local_e8);
        if ((!bVar5) || (ec._M_value != 0)) {
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    (&local_e8.State.
                      super___shared_ptr<llvm::sys::fs::detail::DirIterState,_(__gnu_cxx::_Lock_policy)2>
                      ._M_refcount);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    (&it.State.
                      super___shared_ptr<llvm::sys::fs::detail::DirIterState,_(__gnu_cxx::_Lock_policy)2>
                      ._M_refcount);
          pbVar3 = filenames.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
          pbVar2 = filenames.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          if (filenames.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start !=
              filenames.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish) {
            lVar13 = (long)filenames.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                     (long)filenames.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start;
            uVar8 = lVar13 >> 5;
            lVar10 = 0x3f;
            if (uVar8 != 0) {
              for (; uVar8 >> lVar10 == 0; lVar10 = lVar10 + -1) {
              }
            }
            std::
            __introsort_loop<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<(anonymous_namespace)::FilteredDirectoryContentsTask::getFilteredContents(llvm::StringRef,llbuild::basic::StringList_const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)::_lambda(std::__cxx11::string_const&,std::__cxx11::string_const&)_1_>>
                      (filenames.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start,
                       filenames.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish,((uint)lVar10 ^ 0x3f) * 2 ^ 0x7e);
            if (lVar13 < 0x201) {
              std::
              __insertion_sort<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_comp_iter<(anonymous_namespace)::FilteredDirectoryContentsTask::getFilteredContents(llvm::StringRef,llbuild::basic::StringList_const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)::_lambda(std::__cxx11::string_const&,std::__cxx11::string_const&)_1_>>
                        (pbVar2,pbVar3);
            }
            else {
              pbVar14 = pbVar2 + 0x10;
              std::
              __insertion_sort<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_comp_iter<(anonymous_namespace)::FilteredDirectoryContentsTask::getFilteredContents(llvm::StringRef,llbuild::basic::StringList_const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)::_lambda(std::__cxx11::string_const&,std::__cxx11::string_const&)_1_>>
                        (pbVar2,pbVar14);
              for (; pbVar14 != pbVar3; pbVar14 = pbVar14 + 1) {
                std::
                __unguarded_linear_insert<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Val_comp_iter<(anonymous_namespace)::FilteredDirectoryContentsTask::getFilteredContents(llvm::StringRef,llbuild::basic::StringList_const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)::_lambda(std::__cxx11::string_const&,std::__cxx11::string_const&)_1_>>
                          (pbVar14);
              }
            }
          }
          std::_Vector_base<llvm::StringRef,_std::allocator<llvm::StringRef>_>::~_Vector_base
                    (&filterStrings.
                      super__Vector_base<llvm::StringRef,_std::allocator<llvm::StringRef>_>);
          values.Data = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        ((long)filenames.
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                         (long)filenames.
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start >> 5);
          values.Length = sVar9;
          llbuild::buildsystem::BuildValue::makeFilteredDirectoryContents
                    ((BuildValue *)&filename,
                     (BuildValue *)
                     filenames.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start,values);
          llbuild::buildsystem::BuildValue::toData((ValueType *)&local_168,(BuildValue *)&filename);
          llbuild::core::TaskInterface::complete(&ti_local,(ValueType *)&local_168,false);
          std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                    ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&local_168);
          llbuild::buildsystem::BuildValue::~BuildValue((BuildValue *)&filename);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector(&filenames);
          return;
        }
        path.Data = ((it.State.
                      super___shared_ptr<llvm::sys::fs::detail::DirIterState,_(__gnu_cxx::_Lock_policy)2>
                     ._M_ptr)->CurrentEntry).Path._M_dataplus._M_p;
        path.Length = ((it.State.
                        super___shared_ptr<llvm::sys::fs::detail::DirIterState,_(__gnu_cxx::_Lock_policy)2>
                       ._M_ptr)->CurrentEntry).Path._M_string_length;
        local_168 = llvm::sys::path::filename(path,native);
        llvm::StringRef::str_abi_cxx11_(&filename,&local_168);
        pSVar4 = filterStrings.super__Vector_base<llvm::StringRef,_std::allocator<llvm::StringRef>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        pSVar12 = filterStrings.
                  super__Vector_base<llvm::StringRef,_std::allocator<llvm::StringRef>_>._M_impl.
                  super__Vector_impl_data._M_start;
        do {
          if (pSVar12 == pSVar4) {
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::push_back(&filenames,&filename);
            break;
          }
          std::__cxx11::string::string((string *)&local_168,pSVar12->Data,&local_179);
          std::__cxx11::string::string
                    ((string *)&local_50,
                     (char *)CONCAT44(filename._M_dataplus._M_p._4_4_,
                                      filename._M_dataplus._M_p._0_4_),&local_17a);
          MVar6 = llbuild::basic::sys::filenameMatch((string *)&local_168,&local_50);
          std::__cxx11::string::_M_dispose();
          std::__cxx11::string::_M_dispose();
          pSVar12 = pSVar12 + 1;
        } while (MVar6 != MATCH);
        std::__cxx11::string::_M_dispose();
        pdVar7 = llvm::sys::fs::directory_iterator::increment(&it,&ec);
        llvm::sys::fs::directory_iterator::operator=(&it,pdVar7);
      } while( true );
    }
    puVar11 = (uint64_t *)&stack0xfffffffffffffe28;
    for (lVar10 = 10; lVar10 != 0; lVar10 = lVar10 + -1) {
      *puVar11 = this_00->device;
      this_00 = (FileInfo *)((long)this_00 + (ulong)bVar15 * -0x10 + 8);
      puVar11 = puVar11 + (ulong)bVar15 * -2 + 1;
    }
    llbuild::buildsystem::BuildValue::makeExistingInput(in_stack_fffffffffffffe28);
  }
  else {
    if (KVar1 == MissingInput) {
      filename._M_dataplus._M_p._0_4_ = 3;
    }
    else {
      filename._M_dataplus._M_p._0_4_ = 9;
    }
    filename._M_dataplus._M_p._4_4_ = 0;
    filename._M_string_length._0_4_ = 0;
    filename._12_8_ = 0;
    filename.field_2._4_8_ = 0;
    stack0xffffffffffffff4c = 0;
  }
  llbuild::buildsystem::BuildValue::toData((ValueType *)&local_168,(BuildValue *)&filename);
  llbuild::core::TaskInterface::complete(&ti_local,(ValueType *)&local_168,false);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&local_168);
  llbuild::buildsystem::BuildValue::~BuildValue((BuildValue *)&filename);
  return;
}

Assistant:

virtual void inputsAvailable(TaskInterface ti) override {
    if (directoryValue.isMissingInput()) {
      ti.complete(BuildValue::makeMissingInput().toData());
      return;
    }

    if (!directoryValue.isExistingInput()) {
      ti.complete(BuildValue::makeFailedInput().toData());
      return;
    }

    auto& info = directoryValue.getOutputInfo();

    // Non-directory things are just plain-ol' inputs
    if (!info.isDirectory()) {
      ti.complete(BuildValue::makeExistingInput(info).toData());
      return;
    }

    // Collect the filtered contents
    std::vector<std::string> filenames;
    getFilteredContents(path, filters, filenames);

    // Create the result.
    ti.complete(BuildValue::makeFilteredDirectoryContents(filenames).toData());
  }